

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void ipred_ipf_core_s16(pel *src,pel *dst,int i_dst,s16 *pred,int flt_range_hor,int flt_range_ver,
                       s8 *flt_hor_coef,s8 *flt_ver_coef,int w,int h,int bit_depth)

{
  uint uVar1;
  s32 coeff_cur;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  pel pVar6;
  uint uVar7;
  s32 col;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar5 = ~(-1 << ((byte)bit_depth & 0x1f));
  uVar8 = 0;
  if (0 < flt_range_hor) {
    uVar8 = (ulong)(uint)flt_range_hor;
  }
  uVar9 = (ulong)(uint)flt_range_ver;
  if (flt_range_ver < 1) {
    uVar9 = 0;
  }
  lVar10 = (long)w;
  for (uVar4 = 0; uVar4 != uVar9; uVar4 = uVar4 + 1) {
    iVar3 = (int)flt_ver_coef[uVar4];
    for (uVar2 = 0; uVar8 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = (int)((uint)src[uVar2 + 1] * iVar3 + (uint)src[~uVar4] * (int)flt_hor_coef[uVar2] +
                    (int)pred[uVar2] * ((0x40 - iVar3) - (int)flt_hor_coef[uVar2]) + 0x20) >> 6;
      uVar7 = uVar1;
      if ((int)uVar5 <= (int)uVar1) {
        uVar7 = uVar5;
      }
      pVar6 = (pel)uVar7;
      if ((int)uVar1 < 0) {
        pVar6 = '\0';
      }
      dst[uVar2] = pVar6;
    }
    for (uVar2 = uVar8; (long)uVar2 < lVar10; uVar2 = uVar2 + 1) {
      uVar1 = (int)((uint)src[uVar2 + 1] * iVar3 + (int)pred[uVar2] * (0x40 - iVar3) + 0x20) >> 6;
      uVar7 = uVar5;
      if ((int)uVar1 < (int)uVar5) {
        uVar7 = uVar1;
      }
      pVar6 = (pel)uVar7;
      if ((int)uVar1 < 0) {
        pVar6 = '\0';
      }
      dst[uVar2] = pVar6;
    }
    dst = dst + i_dst;
    pred = pred + lVar10;
  }
  uVar8 = (ulong)(uint)w;
  if (w < 1) {
    uVar8 = 0;
  }
  for (; (long)uVar9 < (long)h; uVar9 = uVar9 + 1) {
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      iVar3 = 0;
      if ((long)uVar4 < (long)flt_range_hor) {
        iVar3 = (int)flt_hor_coef[uVar4];
      }
      uVar1 = (int)((uint)src[(int)~(uint)uVar9] * iVar3 + (int)pred[uVar4] * (0x40 - iVar3) + 0x20)
              >> 6;
      uVar7 = uVar1;
      if ((int)uVar5 <= (int)uVar1) {
        uVar7 = uVar5;
      }
      pVar6 = (pel)uVar7;
      if ((int)uVar1 < 0) {
        pVar6 = '\0';
      }
      dst[uVar4] = pVar6;
    }
    dst = dst + i_dst;
    pred = pred + lVar10;
  }
  return;
}

Assistant:

void ipred_ipf_core_s16(pel *src, pel *dst, int i_dst, s16 *pred, int flt_range_hor, int flt_range_ver, const s8 *flt_hor_coef, const s8 *flt_ver_coef, int w, int h, int bit_depth)
{
    pel *p_top = src + 1;
    int max_val = (1 << bit_depth) - 1;
    int row;

    for (row = 0; row < flt_range_ver; ++row) {
        s32 coeff_top = flt_ver_coef[row];
        int col;

        for (col = 0; col < flt_range_hor; col++) {
            s32 coeff_left = flt_hor_coef[col];
            s32 coeff_cur = 64 - coeff_left - coeff_top;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_top * p_top[col] + coeff_cur * pred[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        for (; col < w; col++) {
            s32 coeff_cur = 64 - coeff_top;
            s32 sample_val = (coeff_top * p_top[col] + coeff_cur * pred[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
        pred += w;
    }
    for (; row < h; ++row) {
        for (s32 col = 0; col < w; col++) {
            s32 coeff_left = (col < flt_range_hor) ? flt_hor_coef[col] : 0;
            s32 coeff_cur = 64 - coeff_left;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_cur * pred[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
        pred += w;
    }
}